

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O1

char * jh_get_lexeme(char *b,int *type)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer pvVar4;
  char cVar5;
  int i;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  int curr_vec [2];
  int local_30 [2];
  
  lVar3 = 0;
  do {
    *(undefined4 *)((long)local_30 + lVar3) = 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  cVar5 = *b;
  pcVar6 = b;
  iVar2 = -1;
  if (cVar5 != '\0') {
    pcVar8 = b;
    iVar7 = -1;
    do {
      lVar3 = 0;
      pvVar4 = jh_dtrans.
               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_30[lVar3] =
             *(int *)(*(long *)&(pvVar4->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[local_30[lVar3]].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + (long)cVar5 * 4);
        lVar3 = lVar3 + 1;
        pvVar4 = pvVar4 + 1;
      } while (lVar3 == 1);
      iVar1 = jh_detect_type(local_30);
      pcVar6 = b;
      iVar2 = iVar1;
      if ((iVar1 < 0) && (pcVar6 = pcVar8, iVar2 = iVar7, iVar1 == -1)) break;
      cVar5 = b[1];
      b = b + 1;
      pcVar8 = pcVar6;
      iVar7 = iVar2;
    } while (cVar5 != '\0');
  }
  *type = iVar2;
  return pcVar6 + 1;
}

Assistant:

char *jh_get_lexeme(char *b, int *type) {
    int curr_vec[jh_type_cnt];
    char *f = b, *old_f = b;
    int old_type = -1, new_type = -1;
    for (int &i : curr_vec)
        i = 1;
    while(*f != '\0') {
        jh_update_vec(curr_vec, *f);
        new_type = jh_detect_type(curr_vec);
        if (new_type >= 0) {
            old_type = new_type;
            old_f = f;
        } else if (new_type == -1) {
            *type = old_type;
            return old_f + 1;
        }
        ++f;
    }
    *type = old_type;
    return old_f + 1;
}